

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O2

int loader_impl_load_from_memory_name(loader_impl impl,char *name,char *buffer,size_t size)

{
  int iVar1;
  int iVar2;
  hash hVar3;
  
  hVar3 = hash_callback_str(buffer);
  iVar1 = snprintf((char *)0x0,0,"%p-%p-%zu-%u",impl,buffer,size,(int)hVar3);
  if ((iVar1 - 1U < 0xfe) &&
     (iVar2 = snprintf(name,(ulong)(iVar1 + 1),"%p-%p-%zu-%u",impl,buffer,size,(int)hVar3),
     iVar2 == iVar1)) {
    return 0;
  }
  return 1;
}

Assistant:

int loader_impl_load_from_memory_name(loader_impl impl, loader_name name, const char *buffer, size_t size)
{
	/* TODO: Improve name with time or uuid */
	static const char format[] = "%p-%p-%" PRIuS "-%u";

	hash h = hash_callback_str((const hash_key)buffer);

	size_t length = snprintf(NULL, 0, format, (const void *)impl, (const void *)buffer, size, (unsigned int)h);

	if (length > 0 && length < LOADER_NAME_SIZE)
	{
		size_t written = snprintf(name, length + 1, format, (const void *)impl, (const void *)buffer, size, (unsigned int)h);

		if (written == length)
		{
			return 0;
		}
	}

	return 1;
}